

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O0

int write_phixfaix(int coff,int compno,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,
                  opj_cio_t *cio)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pos;
  int iVar4;
  int in_ECX;
  long lVar5;
  int in_ESI;
  opj_cio_t *in_R8;
  opj_cio_t *cio_00;
  int numOflayers;
  int numOfprec;
  int numOfres;
  int num_packet;
  int layno;
  int precno;
  int resno;
  opj_packet_info_t packet;
  opj_tile_info_t *tile_Idx;
  int size_of_coding;
  int nmax;
  int i;
  int version;
  int tileno;
  int lenp;
  int len;
  ulong in_stack_ffffffffffffff68;
  undefined1 *v;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_30;
  int local_2c;
  int local_24;
  
  v = &stack0x00000008;
  cio_00 = (opj_cio_t *)(double)in_ECX;
  pow(2.0,32.0);
  pos = cio_tell(in_R8);
  cio_skip(in_R8,4);
  iVar4 = (int)(in_stack_ffffffffffffff68 >> 0x20);
  cio_write(cio_00,(unsigned_long_long)v,iVar4);
  cio_write(cio_00,(unsigned_long_long)v,iVar4);
  local_30 = 0;
  for (local_2c = 0; local_2c <= *(int *)(*(long *)(v + 0x40) + (long)in_ESI * 4);
      local_2c = local_2c + 1) {
    local_30 = *(int *)(*(long *)(v + 0x68) + 0x9c + (long)local_2c * 4) *
               *(int *)(*(long *)(v + 0x68) + 0x18 + (long)local_2c * 4) * *(int *)(v + 0x38) +
               local_30;
  }
  cio_write(cio_00,(unsigned_long_long)v,iVar4);
  cio_write(cio_00,(unsigned_long_long)v,iVar4);
  for (local_24 = 0; local_24 < *(int *)(v + 0x2c) * *(int *)(v + 0x30); local_24 = local_24 + 1) {
    lVar5 = *(long *)(v + 0x68) + (long)local_24 * 0x260;
    local_70 = 0;
    iVar4 = *(int *)(*(long *)(v + 0x40) + (long)in_ESI * 4);
    for (local_64 = 0; local_64 < iVar4 + 1; local_64 = local_64 + 1) {
      iVar1 = *(int *)(lVar5 + 0x18 + (long)local_64 * 4);
      iVar2 = *(int *)(lVar5 + 0x9c + (long)local_64 * 4);
      for (local_68 = 0; local_68 < iVar1 * iVar2; local_68 = local_68 + 1) {
        iVar3 = *(int *)(v + 0x38);
        for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
          in_stack_ffffffffffffff68 = (ulong)*(uint *)(v + 0x18);
          switch(in_stack_ffffffffffffff68) {
          case 0:
            break;
          case 1:
            break;
          case 2:
            break;
          case 3:
            break;
          case 4:
            break;
          default:
            fprintf(_stderr,"failed to ppix indexing\n");
          }
          cio_write(cio_00,(unsigned_long_long)v,0);
          cio_write(cio_00,(unsigned_long_long)v,0);
          local_70 = local_70 + 1;
        }
      }
    }
    for (; local_70 < local_30; local_70 = local_70 + 1) {
      iVar4 = (int)(in_stack_ffffffffffffff68 >> 0x20);
      cio_write(cio_00,(unsigned_long_long)v,iVar4);
      cio_write(cio_00,(unsigned_long_long)v,iVar4);
    }
  }
  iVar4 = cio_tell(in_R8);
  cio_seek(in_R8,pos);
  cio_write(cio_00,(unsigned_long_long)v,(int)(in_stack_ffffffffffffff68 >> 0x20));
  cio_seek(in_R8,pos + (iVar4 - pos));
  return iVar4 - pos;
}

Assistant:

int write_phixfaix( int coff, int compno, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, tileno, version, i, nmax, size_of_coding; /* 4 or 8 */
  opj_tile_info_t *tile_Idx;
  opj_packet_info_t packet;
  int resno, precno, layno, num_packet;
  int numOfres, numOfprec, numOflayers;
  packet.end_ph_pos = packet.start_pos = -1;
  (void)EPHused; /* unused ? */

  if( j2klen > pow( 2, 32)){
    size_of_coding =  8;
    version = 1;
  }
  else{
    size_of_coding = 4;
    version = 0;
  }

  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end]      */
  cio_write( cio, JPIP_FAIX, 4);  /* FAIX                */ 
  cio_write( cio, version,1);     /* Version 0 = 4 bytes */

  nmax = 0;
  for( i=0; i<=cstr_info.numdecompos[compno]; i++)
    nmax += cstr_info.tile[0].ph[i] * cstr_info.tile[0].pw[i] * cstr_info.numlayers;
  
  cio_write( cio, nmax, size_of_coding); /* NMAX */
  cio_write( cio, cstr_info.tw*cstr_info.th, size_of_coding);      /* M    */
  
  for( tileno=0; tileno<cstr_info.tw*cstr_info.th; tileno++){
    tile_Idx = &cstr_info.tile[ tileno];
    
    num_packet = 0;
    numOfres = cstr_info.numdecompos[compno] + 1;

    for( resno=0; resno<numOfres ; resno++){
      numOfprec = tile_Idx->pw[resno]*tile_Idx->ph[resno];
      for( precno=0; precno<numOfprec; precno++){
	numOflayers = cstr_info.numlayers;
	for( layno=0; layno<numOflayers; layno++){
	  
	  switch ( cstr_info.prog){
	  case LRCP:
	    packet = tile_Idx->packet[ ((layno*numOfres+resno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RLCP:
	    packet = tile_Idx->packet[ ((resno*numOflayers+layno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RPCL:
	    packet = tile_Idx->packet[ ((resno*numOfprec+precno)*cstr_info.numcomps+compno)*numOflayers+layno];
	    break;
	  case PCRL:
	    packet = tile_Idx->packet[ ((precno*cstr_info.numcomps+compno)*numOfres+resno)*numOflayers + layno];
	    break;
	  case CPRL:
	    packet = tile_Idx->packet[ ((compno*numOfprec+precno)*numOfres+resno)*numOflayers + layno];
	    break;
	  default:
	    fprintf( stderr, "failed to ppix indexing\n");
	  }

	  cio_write( cio, packet.start_pos-coff, size_of_coding);                /* start position */
	  cio_write( cio, packet.end_ph_pos-packet.start_pos+1, size_of_coding); /* length         */
	  
	  num_packet++;
	}
      }
    }

    /* PADDING */
    while( num_packet < nmax){
      cio_write( cio, 0, size_of_coding); /* start position            */
      cio_write( cio, 0, size_of_coding); /* length                    */
      num_packet++;
    }
  }

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L  */
  cio_seek( cio, lenp+len);

  return len;
}